

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicBuffer.h
# Opt level: O0

void __thiscall
aeron::concurrent::AtomicBuffer::boundsCheck(AtomicBuffer *this,index_t index,uint64_t length)

{
  OutOfBoundsException *this_00;
  char *pcVar1;
  bool bVar2;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  string local_40;
  uint64_t local_20;
  uint64_t length_local;
  AtomicBuffer *pAStack_10;
  index_t index_local;
  AtomicBuffer *this_local;
  
  bVar2 = true;
  if (-1 < index) {
    bVar2 = (ulong)this->m_length - (long)index < length;
  }
  if (!bVar2) {
    return;
  }
  local_20 = length;
  length_local._4_4_ = index;
  pAStack_10 = this;
  this_00 = (OutOfBoundsException *)__cxa_allocate_exception(0x48);
  util::strPrintf_abi_cxx11_
            (&local_40,"index out of bounds[%p]: index=%lld + %lld, capacity=%lld",this,
             (long)length_local._4_4_,local_20,(ulong)this->m_length);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,
             "void aeron::concurrent::AtomicBuffer::boundsCheck(util::index_t, std::uint64_t) const"
             ,&local_71);
  pcVar1 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/AtomicBuffer.h"
                            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,pcVar1,&local_99);
  util::OutOfBoundsException::OutOfBoundsException(this_00,&local_40,&local_70,&local_98,0x1cd);
  __cxa_throw(this_00,&util::OutOfBoundsException::typeinfo,
              util::OutOfBoundsException::~OutOfBoundsException);
}

Assistant:

inline void boundsCheck(util::index_t index, std::uint64_t length) const
    {
#if !defined(DISABLE_BOUNDS_CHECKS)
        if (AERON_COND_EXPECT(index < 0 || (static_cast<std::uint64_t>(m_length) - index) < length, false))
        {
            throw aeron::util::OutOfBoundsException(
                aeron::util::strPrintf(
                    "index out of bounds[%p]: index=%lld + %lld, capacity=%lld",
                    this, static_cast<long long>(index), length, static_cast<long long>(m_length)),
                SOURCEINFO);
        }
#endif
    }